

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverAlternatingMaximization.h
# Opt level: O2

double __thiscall
BGIP_SolverAlternatingMaximization<JointPolicyPureVector>::ComputeBestResponse
          (BGIP_SolverAlternatingMaximization<JointPolicyPureVector> *this,
          JointPolicyPureVector *jpolBG,Index optimizingAgentI)

{
  double dVar1;
  undefined1 auVar2 [16];
  BayesianGameBase *this_00;
  pointer pdVar3;
  bool bVar4;
  Index jaI;
  undefined4 uVar5;
  size_t sVar6;
  size_type __n;
  ulong uVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  reference pvVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  Index best_a;
  Index acI_1;
  ulong uVar12;
  Index acI;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double v_t;
  vector<unsigned_int,_std::allocator<unsigned_int>_> types;
  vector<unsigned_int,_std::allocator<unsigned_int>_> avec;
  shared_ptr<const_BayesianGameIdenticalPayoffInterface> bgip;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  v;
  allocator_type local_a2;
  allocator_type local_a1;
  double local_a0;
  double local_98;
  JointPolicyPureVector *local_90;
  _Vector_base<double,_std::allocator<double>_> local_88;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  BayesianGameBase *local_58;
  shared_count local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  undefined1 extraout_var [56];
  
  this_00 = *(BayesianGameBase **)
             &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
              super_BGIP_IncrementalSolverInterface.field_0x8;
  local_50.pi_ = *(sp_counted_base **)
                  &(this->super_BGIP_IncrementalSolverInterface_T<JointPolicyPureVector>).
                   super_BGIP_IncrementalSolverInterface.field_0x10;
  if (local_50.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_50.pi_)->use_count_ = (local_50.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_90 = jpolBG;
  local_58 = this_00;
  sVar6 = BayesianGameBase::GetNrTypes(this_00,optimizingAgentI);
  __n = (**(code **)(*(long *)this_00 + 0x20))(this_00,optimizingAgentI);
  local_70._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_88,__n,
             (value_type_conflict2 *)&local_70,&local_a1);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,sVar6,(value_type *)&local_88,&local_a2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_88);
  local_a0 = (double)(ulong)optimizingAgentI;
  uVar11 = 0;
  while( true ) {
    uVar7 = BayesianGameBase::GetNrJointTypes();
    if (uVar7 <= uVar11) break;
    __x = BayesianGameBase::JointToIndividualTypeIndices(this_00,(Index)uVar11);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,__x);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88,
                        (size_type)local_a0);
    uVar10 = *pvVar8;
    local_98 = (double)(**(code **)(*(long *)this_00 + 0x68))(this_00,uVar11);
    jaI = (**(code **)(*(long *)local_90 + 0x88))(local_90,uVar11);
    BayesianGameBase::JointToIndividualActionIndices
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,this_00,jaI);
    uVar7 = 0;
    while( true ) {
      uVar9 = (**(code **)(*(long *)this_00 + 0x20))(this_00,optimizingAgentI);
      if (uVar9 <= uVar7) break;
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,
                          (size_type)local_a0);
      *pvVar8 = (value_type)uVar7;
      uVar5 = (**(code **)(*(long *)this_00 + 0x38))(this_00,&local_70);
      auVar14._0_8_ = (**(code **)(*(long *)this_00 + 0x80))(this_00,uVar11,uVar5);
      auVar14._8_56_ = extraout_var;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_98;
      pdVar3 = local_48.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar10].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = pdVar3[uVar7];
      auVar13 = vfmadd213sd_fma(auVar14._0_16_,auVar15,auVar2);
      pdVar3[uVar7] = auVar13._0_8_;
      uVar7 = (ulong)((value_type)uVar7 + 1);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_70);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
    uVar11 = (ulong)((Index)uVar11 + 1);
  }
  uVar10 = 0;
  local_98 = 0.0;
  while( true ) {
    sVar6 = BayesianGameBase::GetNrTypes(this_00,optimizingAgentI);
    uVar11 = (ulong)uVar10;
    if (sVar6 <= uVar11) break;
    local_a0 = -1.79769313486232e+308;
    uVar7 = 0;
    uVar9 = 0;
    while (uVar12 = uVar9, uVar9 = (**(code **)(*(long *)this_00 + 0x20))(this_00,optimizingAgentI),
          uVar12 < uVar9) {
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_a0;
      uVar9 = (ulong)((int)uVar12 + 1);
      dVar1 = local_48.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar11].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar12];
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar1;
      auVar13 = vmaxsd_avx(auVar13,auVar16);
      bVar4 = local_a0 < dVar1;
      local_a0 = auVar13._0_8_;
      if (bVar4) {
        uVar7 = uVar12;
      }
    }
    (**(code **)(*(long *)local_90 + 0x80))(local_90,optimizingAgentI,uVar11,uVar7);
    uVar10 = uVar10 + 1;
    local_98 = local_98 + local_a0;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  boost::detail::shared_count::~shared_count(&local_50);
  return local_98;
}

Assistant:

double ComputeBestResponse(JP & jpolBG, 
            Index optimizingAgentI)
        {
            if(DEBUG_CBR)
            {
                std::cout << "ComputeBestResponse called - current jpolBG:"<<std::endl;
                jpolBG.Print();
                std::cout << "value="<<this->Evaluate(jpolBG)<<std::endl;
            }
            boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> bgip=
                this->GetBGIPI();
            const BayesianGameIdenticalPayoffInterface* bgipRawPtr=bgip.get();
            Index agI = optimizingAgentI;
            std::vector< std::vector<double> > v (bgip->GetNrTypes(agI), std::vector<double>(
                                            bgipRawPtr->GetNrActions(agI), 0.0) );
    
            if(DEBUG_CBR)
                std::cout << "ComputeBestResponse: compute all type-action values for agent agI..."<<std::endl;
            //compute all type-action values for agent agI
            for(Index jt = 0; jt < bgipRawPtr->GetNrJointTypes(); jt++)
            {
                std::vector<Index> types = bgipRawPtr->JointToIndividualTypeIndices(jt);
                Index type = types.at(agI);
                double jtProb = bgipRawPtr->GetProbability(jt);
                Index jaI = jpolBG.GetJointActionIndex(jt);
                std::vector<Index> avec = bgipRawPtr->JointToIndividualActionIndices(jaI);
                for(Index acI =0 ; acI < bgipRawPtr->GetNrActions(agI); acI++)
                {
                    avec.at(agI) = acI;
                    Index jaInew = bgipRawPtr->IndividualToJointActionIndices(avec);
                    double u =  bgipRawPtr->GetUtility(jt, jaInew);
                    v[type][acI] +=  jtProb * u;
                    if(DEBUG_CBR)
                        std::cout << "updated v[type][acI]="<<v[type][acI]<< 
                            "(jtProb=" << jtProb << ", u=" << u <<")" <<std::endl;
                }
            }
            if(DEBUG_CBR)
                std::cout << "ComputeBestResponse: compute the best response and value..."<<std::endl;
            //compute the best response and value
            double v_best = 0.0;
            for(Index type = 0; type < bgipRawPtr->GetNrTypes(agI); type++)
            {
                double v_t = -DBL_MAX;
                Index best_a = 0;
                for(Index acI = 0; acI < bgipRawPtr->GetNrActions(agI); acI++)
                {
                    double v_t_a = v[type][acI];
                    if(v_t_a > v_t)
                    {
                        best_a = acI;
                        v_t = v_t_a;
                    }
                }
                v_best += v_t;
                jpolBG.SetAction(agI, type, best_a);
            }
            return v_best;
        }